

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O2

void gost2012_finish_hash(gost2012_hash_ctx *CTX,uchar *digest)

{
  uint512_u *h;
  uint512_u *N;
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  
  memset((void *)((long)&CTX->buffer + CTX->bufsize),0,0x40 - CTX->bufsize);
  (CTX->buffer).B[CTX->bufsize] = '\x01';
  h = &CTX->h;
  N = &CTX->N;
  g(h,N,&CTX->buffer);
  add512(&CTX->Sigma,&CTX->buffer);
  (CTX->buffer).QWORD[5] = 0;
  (CTX->buffer).QWORD[6] = 0;
  (CTX->buffer).QWORD[3] = 0;
  (CTX->buffer).QWORD[4] = 0;
  (CTX->buffer).QWORD[7] = 0;
  (CTX->buffer).QWORD[1] = 0;
  (CTX->buffer).QWORD[2] = 0;
  (CTX->buffer).QWORD[0] = CTX->bufsize << 3;
  add512(N,&CTX->buffer);
  g(h,&buffer0,N);
  g(h,&buffer0,&CTX->Sigma);
  CTX->bufsize = 0;
  if (CTX->digest_size == 0x100) {
    uVar4 = *(undefined4 *)((long)&CTX->h + 0x20);
    uVar5 = *(undefined4 *)((long)&CTX->h + 0x24);
    uVar6 = *(undefined4 *)((long)&CTX->h + 0x28);
    uVar7 = *(undefined4 *)((long)&CTX->h + 0x2c);
    uVar8 = *(undefined4 *)((long)&CTX->h + 0x30);
    uVar9 = *(undefined4 *)((long)&CTX->h + 0x34);
    uVar10 = *(undefined4 *)((long)&CTX->h + 0x38);
    uVar11 = *(undefined4 *)((long)&CTX->h + 0x3c);
  }
  else {
    uVar4 = *(undefined4 *)h;
    uVar5 = *(undefined4 *)((long)&CTX->h + 4);
    uVar6 = *(undefined4 *)((long)&CTX->h + 8);
    uVar7 = *(undefined4 *)((long)&CTX->h + 0xc);
    uVar8 = *(undefined4 *)((long)&CTX->h + 0x10);
    uVar9 = *(undefined4 *)((long)&CTX->h + 0x14);
    uVar10 = *(undefined4 *)((long)&CTX->h + 0x18);
    uVar11 = *(undefined4 *)((long)&CTX->h + 0x1c);
    uVar1 = (CTX->h).QWORD[4];
    uVar2 = (CTX->h).QWORD[5];
    uVar3 = (CTX->h).QWORD[7];
    *(unsigned_long_long *)(digest + 0x30) = (CTX->h).QWORD[6];
    *(unsigned_long_long *)(digest + 0x38) = uVar3;
    *(unsigned_long_long *)(digest + 0x20) = uVar1;
    *(unsigned_long_long *)(digest + 0x28) = uVar2;
  }
  *(undefined4 *)(digest + 0x10) = uVar8;
  *(undefined4 *)(digest + 0x14) = uVar9;
  *(undefined4 *)(digest + 0x18) = uVar10;
  *(undefined4 *)(digest + 0x1c) = uVar11;
  *(undefined4 *)digest = uVar4;
  *(undefined4 *)(digest + 4) = uVar5;
  *(undefined4 *)(digest + 8) = uVar6;
  *(undefined4 *)(digest + 0xc) = uVar7;
  return;
}

Assistant:

void gost2012_finish_hash(gost2012_hash_ctx * CTX, unsigned char *digest)
{
    stage3(CTX);

    CTX->bufsize = 0;

    if (CTX->digest_size == 256)
        memcpy(digest, &(CTX->h.QWORD[4]), 32);
    else
        memcpy(digest, &(CTX->h.QWORD[0]), 64);
}